

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

void __thiscall
Diligent::GetTextureFormatAttribs::FormatToTextureFormatAttribsMap::FormatToTextureFormatAttribsMap
          (FormatToTextureFormatAttribsMap *this)

{
  long lVar1;
  TEXTURE_FORMAT *pTVar2;
  ulong uVar3;
  string msg;
  string local_50;
  
  lVar1 = 8;
  do {
    *(char **)(&GetDefaultTextureViewFormat(Diligent::TEXTURE_FORMAT,Diligent::TEXTURE_VIEW_TYPE,unsigned_int)
                ::FmtConverter + lVar1) = "TEX_FORMAT_UNKNOWN";
    *(undefined8 *)((long)&FormatToTexFormatAttribs.FmtAttribs._M_elems[0].Name + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x6a8);
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].Name = "TEX_FORMAT_RGBA32_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].Format = TEX_FORMAT_RGBA32_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[1].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].Name = "TEX_FORMAT_RGBA32_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].Format = TEX_FORMAT_RGBA32_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[2].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].Name = "TEX_FORMAT_RGBA32_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].Format = TEX_FORMAT_RGBA32_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[3].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].Name = "TEX_FORMAT_RGBA32_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].Format = TEX_FORMAT_RGBA32_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[4].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].Name = "TEX_FORMAT_RGB32_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].Format = TEX_FORMAT_RGB32_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[5].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].Name = "TEX_FORMAT_RGB32_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].Format = TEX_FORMAT_RGB32_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[6].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].Name = "TEX_FORMAT_RGB32_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].Format = TEX_FORMAT_RGB32_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[7].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].Name = "TEX_FORMAT_RGB32_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].Format = TEX_FORMAT_RGB32_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[8].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].Name = "TEX_FORMAT_RGBA16_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].Format = TEX_FORMAT_RGBA16_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[9].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].Name = "TEX_FORMAT_RGBA16_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].Format = TEX_FORMAT_RGBA16_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[10].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].Name = "TEX_FORMAT_RGBA16_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].Format = TEX_FORMAT_RGBA16_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xb].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].Name = "TEX_FORMAT_RGBA16_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].Format = TEX_FORMAT_RGBA16_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xc].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].Name = "TEX_FORMAT_RGBA16_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].Format = TEX_FORMAT_RGBA16_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].ComponentType = COMPONENT_TYPE_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xd].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].Name = "TEX_FORMAT_RGBA16_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].Format = TEX_FORMAT_RGBA16_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xe].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].Name = "TEX_FORMAT_RG32_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].Format = TEX_FORMAT_RG32_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0xf].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].Name = "TEX_FORMAT_RG32_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].Format = TEX_FORMAT_RG32_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x10].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].Name = "TEX_FORMAT_RG32_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].Format = TEX_FORMAT_RG32_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x11].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].Name = "TEX_FORMAT_RG32_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].Format = TEX_FORMAT_RG32_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x12].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].Name = "TEX_FORMAT_R32G8X24_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].Format = TEX_FORMAT_R32G8X24_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x13].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].Name = "TEX_FORMAT_D32_FLOAT_S8X24_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].Format = TEX_FORMAT_D32_FLOAT_S8X24_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x14].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].Name = "TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].Format = TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x15].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].Name = "TEX_FORMAT_X32_TYPELESS_G8X24_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].Format = TEX_FORMAT_X32_TYPELESS_G8X24_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x16].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].Name = "TEX_FORMAT_RGB10A2_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].Format = TEX_FORMAT_RGB10A2_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x17].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].Name = "TEX_FORMAT_RGB10A2_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].Format = TEX_FORMAT_RGB10A2_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x18].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].Name = "TEX_FORMAT_RGB10A2_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].Format = TEX_FORMAT_RGB10A2_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x19].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].Name = "TEX_FORMAT_R11G11B10_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].Format = TEX_FORMAT_R11G11B10_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1a].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].Name = "TEX_FORMAT_RGBA8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].Format = TEX_FORMAT_RGBA8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1b].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].Name = "TEX_FORMAT_RGBA8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].Format = TEX_FORMAT_RGBA8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1c].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].Name = "TEX_FORMAT_RGBA8_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].Format = TEX_FORMAT_RGBA8_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].ComponentType = COMPONENT_TYPE_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1d].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].Name = "TEX_FORMAT_RGBA8_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].Format = TEX_FORMAT_RGBA8_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1e].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].Name = "TEX_FORMAT_RGBA8_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].Format = TEX_FORMAT_RGBA8_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].ComponentType = COMPONENT_TYPE_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x1f].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].Name = "TEX_FORMAT_RGBA8_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].Format = TEX_FORMAT_RGBA8_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x20].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].Name = "TEX_FORMAT_RG16_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].Format = TEX_FORMAT_RG16_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x21].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].Name = "TEX_FORMAT_RG16_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].Format = TEX_FORMAT_RG16_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x22].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].Name = "TEX_FORMAT_RG16_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].Format = TEX_FORMAT_RG16_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x23].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].Name = "TEX_FORMAT_RG16_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].Format = TEX_FORMAT_RG16_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x24].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].Name = "TEX_FORMAT_RG16_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].Format = TEX_FORMAT_RG16_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].ComponentType = COMPONENT_TYPE_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x25].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].Name = "TEX_FORMAT_RG16_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].Format = TEX_FORMAT_RG16_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x26].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].Name = "TEX_FORMAT_R32_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].Format = TEX_FORMAT_R32_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x27].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].Name = "TEX_FORMAT_D32_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].Format = TEX_FORMAT_D32_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].ComponentType = COMPONENT_TYPE_DEPTH;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x28].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].Name = "TEX_FORMAT_R32_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].Format = TEX_FORMAT_R32_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x29].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].Name = "TEX_FORMAT_R32_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].Format = TEX_FORMAT_R32_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2a].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].Name = "TEX_FORMAT_R32_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].Format = TEX_FORMAT_R32_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2b].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].Name = "TEX_FORMAT_R24G8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].Format = TEX_FORMAT_R24G8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2c].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].Name = "TEX_FORMAT_D24_UNORM_S8_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].Format = TEX_FORMAT_D24_UNORM_S8_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2d].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].Name = "TEX_FORMAT_R24_UNORM_X8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].Format = TEX_FORMAT_R24_UNORM_X8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2e].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].Name = "TEX_FORMAT_X24_TYPELESS_G8_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].Format = TEX_FORMAT_X24_TYPELESS_G8_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].ComponentType = COMPONENT_TYPE_DEPTH_STENCIL;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x2f].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].Name = "TEX_FORMAT_RG8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].Format = TEX_FORMAT_RG8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x30].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].Name = "TEX_FORMAT_RG8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].Format = TEX_FORMAT_RG8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x31].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].Name = "TEX_FORMAT_RG8_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].Format = TEX_FORMAT_RG8_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x32].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].Name = "TEX_FORMAT_RG8_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].Format = TEX_FORMAT_RG8_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].ComponentType = COMPONENT_TYPE_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x33].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].Name = "TEX_FORMAT_RG8_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].Format = TEX_FORMAT_RG8_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x34].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].Name = "TEX_FORMAT_R16_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].Format = TEX_FORMAT_R16_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x35].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].Name = "TEX_FORMAT_R16_FLOAT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].Format = TEX_FORMAT_R16_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].ComponentType = COMPONENT_TYPE_FLOAT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x36].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].Name = "TEX_FORMAT_D16_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].Format = TEX_FORMAT_D16_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].ComponentType = COMPONENT_TYPE_DEPTH;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x37].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].Name = "TEX_FORMAT_R16_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].Format = TEX_FORMAT_R16_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x38].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].Name = "TEX_FORMAT_R16_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].Format = TEX_FORMAT_R16_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x39].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].Name = "TEX_FORMAT_R16_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].Format = TEX_FORMAT_R16_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].ComponentType = COMPONENT_TYPE_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3a].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].Name = "TEX_FORMAT_R16_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].Format = TEX_FORMAT_R16_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3b].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].Name = "TEX_FORMAT_R8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].Format = TEX_FORMAT_R8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3c].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].Name = "TEX_FORMAT_R8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].Format = TEX_FORMAT_R8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3d].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].Name = "TEX_FORMAT_R8_UINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].Format = TEX_FORMAT_R8_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].ComponentType = COMPONENT_TYPE_UINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3e].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].Name = "TEX_FORMAT_R8_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].Format = TEX_FORMAT_R8_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].ComponentType = COMPONENT_TYPE_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x3f].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].Name = "TEX_FORMAT_R8_SINT";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].Format = TEX_FORMAT_R8_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].ComponentType = COMPONENT_TYPE_SINT;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x40].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].Name = "TEX_FORMAT_A8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].Format = TEX_FORMAT_A8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x41].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].Name = "TEX_FORMAT_R1_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].Format = TEX_FORMAT_R1_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x42].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].Name = "TEX_FORMAT_RGB9E5_SHAREDEXP";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].Format = TEX_FORMAT_RGB9E5_SHAREDEXP;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x43].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].Name = "TEX_FORMAT_RG8_B8G8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].Format = TEX_FORMAT_RG8_B8G8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x44].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].Name = "TEX_FORMAT_G8R8_G8B8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].Format = TEX_FORMAT_G8R8_G8B8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x45].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].Name = "TEX_FORMAT_BC1_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].Format = TEX_FORMAT_BC1_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x46].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].Name = "TEX_FORMAT_BC1_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].Format = TEX_FORMAT_BC1_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x47].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].Name = "TEX_FORMAT_BC1_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].Format = TEX_FORMAT_BC1_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x48].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].Name = "TEX_FORMAT_BC2_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].Format = TEX_FORMAT_BC2_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x49].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].Name = "TEX_FORMAT_BC2_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].Format = TEX_FORMAT_BC2_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4a].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].Name = "TEX_FORMAT_BC2_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].Format = TEX_FORMAT_BC2_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4b].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].Name = "TEX_FORMAT_BC3_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].Format = TEX_FORMAT_BC3_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4c].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].Name = "TEX_FORMAT_BC3_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].Format = TEX_FORMAT_BC3_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4d].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].Name = "TEX_FORMAT_BC3_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].Format = TEX_FORMAT_BC3_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4e].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].Name = "TEX_FORMAT_BC4_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].Format = TEX_FORMAT_BC4_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x4f].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].Name = "TEX_FORMAT_BC4_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].Format = TEX_FORMAT_BC4_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x50].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].Name = "TEX_FORMAT_BC4_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].Format = TEX_FORMAT_BC4_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x51].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].Name = "TEX_FORMAT_BC5_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].Format = TEX_FORMAT_BC5_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x52].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].Name = "TEX_FORMAT_BC5_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].Format = TEX_FORMAT_BC5_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x53].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].Name = "TEX_FORMAT_BC5_SNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].Format = TEX_FORMAT_BC5_SNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].NumComponents = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x54].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].Name = "TEX_FORMAT_B5G6R5_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].Format = TEX_FORMAT_B5G6R5_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x55].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].Name = "TEX_FORMAT_B5G5R5A1_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].Format = TEX_FORMAT_B5G5R5A1_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].ComponentSize = '\x02';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x56].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].Name = "TEX_FORMAT_BGRA8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].Format = TEX_FORMAT_BGRA8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x57].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].Name = "TEX_FORMAT_BGRX8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].Format = TEX_FORMAT_BGRX8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].ComponentType = COMPONENT_TYPE_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x58].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].Name = "TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].Format = TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].ComponentSize = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].NumComponents = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].ComponentType = COMPONENT_TYPE_COMPOUND;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x59].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].Name = "TEX_FORMAT_BGRA8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].Format = TEX_FORMAT_BGRA8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5a].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].Name = "TEX_FORMAT_BGRA8_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].Format = TEX_FORMAT_BGRA8_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].ComponentType = COMPONENT_TYPE_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5b].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].Name = "TEX_FORMAT_BGRX8_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].Format = TEX_FORMAT_BGRX8_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].ComponentType = COMPONENT_TYPE_UNDEFINED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5c].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].Name = "TEX_FORMAT_BGRX8_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].Format = TEX_FORMAT_BGRX8_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].ComponentSize = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].ComponentType = COMPONENT_TYPE_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].BlockWidth = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5d].BlockHeight = '\x01';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].Name = "TEX_FORMAT_BC6H_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].Format = TEX_FORMAT_BC6H_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5e].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].Name = "TEX_FORMAT_BC6H_UF16";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].Format = TEX_FORMAT_BC6H_UF16;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x5f].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].Name = "TEX_FORMAT_BC6H_SF16";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].Format = TEX_FORMAT_BC6H_SF16;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x60].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].Name = "TEX_FORMAT_BC7_TYPELESS";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].Format = TEX_FORMAT_BC7_TYPELESS;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].IsTypeless = true;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x61].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].Name = "TEX_FORMAT_BC7_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].Format = TEX_FORMAT_BC7_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x62].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].Name = "TEX_FORMAT_BC7_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].Format = TEX_FORMAT_BC7_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[99].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].Name = "TEX_FORMAT_ETC2_RGB8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].Format = TEX_FORMAT_ETC2_RGB8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[100].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].Name = "TEX_FORMAT_ETC2_RGB8_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].Format = TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].NumComponents = '\x03';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x65].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].Name = "TEX_FORMAT_ETC2_RGB8A1_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].Format = TEX_FORMAT_ETC2_RGB8A1_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x66].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].Name = "TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].Format = TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].ComponentSize = '\b';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x67].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].Name = "TEX_FORMAT_ETC2_RGBA8_UNORM";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].Format = TEX_FORMAT_ETC2_RGBA8_UNORM;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x68].BlockHeight = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].Name = "TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB";
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].Format = TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].ComponentSize = '\x10';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].NumComponents = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].ComponentType = COMPONENT_TYPE_COMPRESSED;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].IsTypeless = false;
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].BlockWidth = '\x04';
  FormatToTexFormatAttribs.FmtAttribs._M_elems[0x69].BlockHeight = '\x04';
  pTVar2 = &FormatToTexFormatAttribs.FmtAttribs._M_elems[0].Format;
  uVar3 = 0;
  do {
    if (uVar3 != *pTVar2) {
      FormatString<char[21]>(&local_50,(char (*) [21])"Uninitialized format");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"FormatToTextureFormatAttribsMap",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x1a9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    uVar3 = uVar3 + 1;
    pTVar2 = pTVar2 + 8;
  } while (uVar3 != 0x6a);
  return;
}

Assistant:

FormatToTextureFormatAttribsMap()
        {
            // clang-format off
#define INIT_TEX_FORMAT_INFO(TexFmt, ComponentSize, NumComponents, ComponentType, IsTypeless, BlockWidth, BlockHeight) \
            FmtAttribs[ TexFmt ] = TextureFormatAttribs{#TexFmt, TexFmt, ComponentSize, NumComponents, ComponentType, IsTypeless, BlockWidth, BlockHeight};

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_TYPELESS,         4, 4, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_FLOAT,            4, 4, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_UINT,             4, 4, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA32_SINT,             4, 4, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_TYPELESS,          4, 3, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_FLOAT,             4, 3, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_UINT,              4, 3, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB32_SINT,              4, 3, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_TYPELESS,         2, 4, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_FLOAT,            2, 4, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_UNORM,            2, 4, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_UINT,             2, 4, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_SNORM,            2, 4, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA16_SINT,             2, 4, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_TYPELESS,           4, 2, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_FLOAT,              4, 2, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_UINT,               4, 2, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG32_SINT,               4, 2, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32G8X24_TYPELESS,       4, 2, COMPONENT_TYPE_DEPTH_STENCIL,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D32_FLOAT_S8X24_UINT,    4, 2, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,4, 2, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_X32_TYPELESS_G8X24_UINT, 4, 2, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB10A2_TYPELESS,        4, 1, COMPONENT_TYPE_COMPOUND,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB10A2_UNORM,           4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB10A2_UINT,            4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R11G11B10_FLOAT,         4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_TYPELESS,          1, 4, COMPONENT_TYPE_UNDEFINED,   true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM,             1, 4, COMPONENT_TYPE_UNORM,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_UNORM_SRGB,        1, 4, COMPONENT_TYPE_UNORM_SRGB, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_UINT,              1, 4, COMPONENT_TYPE_UINT,       false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_SNORM,             1, 4, COMPONENT_TYPE_SNORM,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGBA8_SINT,              1, 4, COMPONENT_TYPE_SINT,       false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_TYPELESS,           2, 2, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_FLOAT,              2, 2, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_UNORM,              2, 2, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_UINT,               2, 2, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_SNORM,              2, 2, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG16_SINT,               2, 2, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_TYPELESS,            4, 1, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D32_FLOAT,               4, 1, COMPONENT_TYPE_DEPTH,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_FLOAT,               4, 1, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_UINT,                4, 1, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R32_SINT,                4, 1, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R24G8_TYPELESS,          4, 1, COMPONENT_TYPE_DEPTH_STENCIL,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D24_UNORM_S8_UINT,       4, 1, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R24_UNORM_X8_TYPELESS,   4, 1, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_X24_TYPELESS_G8_UINT,    4, 1, COMPONENT_TYPE_DEPTH_STENCIL, false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_TYPELESS,            1, 2, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_UNORM,               1, 2, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_UINT,                1, 2, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_SNORM,               1, 2, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_SINT,                1, 2, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_TYPELESS,            2, 1, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_FLOAT,               2, 1, COMPONENT_TYPE_FLOAT,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_D16_UNORM,               2, 1, COMPONENT_TYPE_DEPTH,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_UNORM,               2, 1, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_UINT,                2, 1, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_SNORM,               2, 1, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R16_SINT,                2, 1, COMPONENT_TYPE_SINT,      false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_TYPELESS,             1, 1, COMPONENT_TYPE_UNDEFINED,  true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_UNORM,                1, 1, COMPONENT_TYPE_UNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_UINT,                 1, 1, COMPONENT_TYPE_UINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_SNORM,                1, 1, COMPONENT_TYPE_SNORM,     false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R8_SINT,                 1, 1, COMPONENT_TYPE_SINT,      false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_A8_UNORM,                1, 1, COMPONENT_TYPE_UNORM,     false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R1_UNORM,                1, 1, COMPONENT_TYPE_UNORM,    false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RGB9E5_SHAREDEXP,        4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_RG8_B8G8_UNORM,          1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_G8R8_G8B8_UNORM,         1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);

            // http://www.g-truc.net/post-0335.html
            // http://renderingpipeline.com/2012/07/texture-compression/
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC1_TYPELESS,            8,  3, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC1_UNORM,               8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC1_UNORM_SRGB,          8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC2_TYPELESS,            16, 4, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC2_UNORM,               16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC2_UNORM_SRGB,          16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC3_TYPELESS,            16, 4, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC3_UNORM,               16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC3_UNORM_SRGB,          16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC4_TYPELESS,            8,  1, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC4_UNORM,               8,  1, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC4_SNORM,               8,  1, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC5_TYPELESS,            16, 2, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC5_UNORM,               16, 2, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC5_SNORM,               16, 2, COMPONENT_TYPE_COMPRESSED, false, 4,4);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_B5G6R5_UNORM,            2, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_B5G5R5A1_UNORM,          2, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM,             1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM,             1, 4, COMPONENT_TYPE_UNORM,    false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM,  4, 1, COMPONENT_TYPE_COMPOUND, false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRA8_TYPELESS,          1, 4, COMPONENT_TYPE_UNDEFINED,     true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRA8_UNORM_SRGB,        1, 4, COMPONENT_TYPE_UNORM_SRGB,   false, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRX8_TYPELESS,          1, 4, COMPONENT_TYPE_UNDEFINED,     true, 1,1);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BGRX8_UNORM_SRGB,        1, 4, COMPONENT_TYPE_UNORM_SRGB,   false, 1,1);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC6H_TYPELESS,           16, 3, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC6H_UF16,               16, 3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC6H_SF16,               16, 3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC7_TYPELESS,            16, 4, COMPONENT_TYPE_COMPRESSED,  true, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC7_UNORM,               16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_BC7_UNORM_SRGB,          16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);

            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM,         8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,    8,  3, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM,       8,  4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,  8,  4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM,        16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
            INIT_TEX_FORMAT_INFO(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,   16, 4, COMPONENT_TYPE_COMPRESSED, false, 4,4);
#undef  INIT_TEX_FORMAT_INFO
            // clang-format on
            static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Not all texture formats initialized.");

#ifdef DILIGENT_DEBUG
            for (Uint32 Fmt = TEX_FORMAT_UNKNOWN; Fmt < TEX_FORMAT_NUM_FORMATS; ++Fmt)
                VERIFY(FmtAttribs[Fmt].Format == static_cast<TEXTURE_FORMAT>(Fmt), "Uninitialized format");
#endif
        }